

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O0

void PaUtil_DestroyAllocationGroup(PaUtilAllocationGroup *group)

{
  long in_RDI;
  PaUtilAllocationGroupLink *next;
  PaUtilAllocationGroupLink *current;
  undefined8 local_10;
  
  local_10 = *(undefined8 **)(in_RDI + 8);
  while (local_10 != (undefined8 *)0x0) {
    local_10 = (undefined8 *)*local_10;
    PaUtil_FreeMemory((void *)0x107a29);
  }
  PaUtil_FreeMemory((void *)0x107a3e);
  return;
}

Assistant:

void PaUtil_DestroyAllocationGroup( PaUtilAllocationGroup* group )
{
    struct PaUtilAllocationGroupLink *current = group->linkBlocks;
    struct PaUtilAllocationGroupLink *next;

    while( current )
    {
        next = current->next;
        PaUtil_FreeMemory( current->buffer );
        current = next;
    }

    PaUtil_FreeMemory( group );
}